

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRC.hpp
# Opt level: O1

uint __thiscall
CRC::Generator<unsigned_int,4294967295u,4294967295u,true,true>::
compute_crc<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (Generator<unsigned_int,4294967295u,4294967295u,true,true> *this,
          __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          begin,__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                end)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  byte bVar4;
  
  *(undefined4 *)(this + 0x400) = 0xffffffff;
  if (begin._M_current != end._M_current) {
    uVar1 = 0xffffffff;
    do {
      bVar4 = *begin._M_current << 4 | *begin._M_current >> 4;
      bVar4 = bVar4 >> 2 & 0x33 | (bVar4 & 0x33) << 2;
      uVar1 = uVar1 << 8 ^
              *(uint *)(this + (ulong)((uint)(byte)(bVar4 >> 1 & 0x55 | (bVar4 & 0x55) * '\x02') ^
                                      uVar1 >> 0x18) * 4);
      *(uint *)(this + 0x400) = uVar1;
      begin._M_current = begin._M_current + 1;
    } while (begin._M_current != end._M_current);
  }
  uVar2 = ~*(uint *)(this + 0x400);
  uVar1 = 0;
  lVar3 = 4;
  do {
    bVar4 = (byte)uVar2 << 4 | (byte)uVar2 >> 4;
    bVar4 = bVar4 >> 2 & 0x33 | (bVar4 & 0x33) << 2;
    uVar1 = (uint)(byte)(bVar4 >> 1 & 0x55 | (bVar4 & 0x55) * '\x02') | uVar1 << 8;
    uVar2 = uVar2 >> 8;
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  return uVar1;
}

Assistant:

void add(uint8_t byte) {
			if constexpr (reflect_input) byte = reverse_byte(byte);
			value_ = IntType((value_ << 8) ^ xor_table[(value_ >> multibyte_shift) ^ byte]);
		}